

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

char * lua_setlocal(lua_State *L,lua_Debug *ar,int n)

{
  long lVar1;
  char *pcVar2;
  StkId pos;
  StkId local_10;
  
  local_10 = (StkId)0x0;
  pcVar2 = luaG_findlocal(L,ar->i_ci,n,&local_10);
  if (pcVar2 != (char *)0x0) {
    lVar1 = (L->top).offset;
    (local_10->val).value_ = *(Value *)(lVar1 + -0x10);
    (local_10->val).tt_ = *(lu_byte *)(lVar1 + -8);
    (L->top).p = (StkId)((L->top).offset + -0x10);
  }
  return pcVar2;
}

Assistant:

LUA_API const char *lua_setlocal (lua_State *L, const lua_Debug *ar, int n) {
  StkId pos = NULL;  /* to avoid warnings */
  const char *name;
  lua_lock(L);
  name = luaG_findlocal(L, ar->i_ci, n, &pos);
  if (name) {
    api_checkpop(L, 1);
    setobjs2s(L, pos, L->top.p - 1);
    L->top.p--;  /* pop value */
  }
  lua_unlock(L);
  return name;
}